

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O1

void test_case_unsigned_mul(zt_unit_test *test,void *data)

{
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  return;
}

Assistant:

static void
test_case_unsigned_mul(struct zt_unit_test *test, void *data UNUSED)
{
    /* unsigned multiplication */
    /* char */
    ZT_UNIT_ASSERT(test, zt_uchar_mul(1, UCHAR_MAX) == UCHAR_MAX);
    ZT_UNIT_ASSERT(test, zt_uchar_mul(UCHAR_MAX, 1) == UCHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_uchar_mul(1, UCHAR_MIN) == UCHAR_MIN);
    ZT_UNIT_ASSERT(test, zt_uchar_mul(UCHAR_MIN, 1) == UCHAR_MIN);

    ZT_UNIT_ASSERT(test, zt_uchar_mul(2, UCHAR_MAX / 2) == UCHAR_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_uchar_mul(UCHAR_MAX / 2, 2) == UCHAR_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(2, UCHAR_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(UCHAR_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(2, UCHAR_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(UCHAR_MAX / 2 + 1, 2)); */

    /* short */
    ZT_UNIT_ASSERT(test, zt_ushort_mul(1, USHORT_MAX) == USHORT_MAX);
    ZT_UNIT_ASSERT(test, zt_ushort_mul(USHORT_MAX, 1) == USHORT_MAX);

    ZT_UNIT_ASSERT(test, zt_ushort_mul(1, USHORT_MIN) == USHORT_MIN);
    ZT_UNIT_ASSERT(test, zt_ushort_mul(USHORT_MIN, 1) == USHORT_MIN);

    ZT_UNIT_ASSERT(test, zt_ushort_mul(2, USHORT_MAX / 2) == USHORT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_ushort_mul(USHORT_MAX / 2, 2) == USHORT_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(2, USHORT_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(USHORT_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(2, USHORT_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(USHORT_MAX / 2 + 1, 2)); */

    /* int */
    ZT_UNIT_ASSERT(test, zt_uint_mul(1, UINT_MAX) == UINT_MAX);
    ZT_UNIT_ASSERT(test, zt_uint_mul(UINT_MAX, 1) == UINT_MAX);

    ZT_UNIT_ASSERT(test, zt_uint_mul(1, UINT_MIN) == UINT_MIN);
    ZT_UNIT_ASSERT(test, zt_uint_mul(UINT_MIN, 1) == UINT_MIN);

    ZT_UNIT_ASSERT(test, zt_uint_mul(2, UINT_MAX / 2) == UINT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_uint_mul(UINT_MAX / 2, 2) == UINT_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(2, UINT_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(UINT_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(2, UINT_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(UINT_MAX / 2 + 1, 2)); */

# ifndef __x86_64__
    /* long */
    ZT_UNIT_ASSERT(test, zt_ulong_mul(1, ULONG_MAX) == ULONG_MAX);
    ZT_UNIT_ASSERT(test, zt_ulong_mul(ULONG_MAX, 1) == ULONG_MAX);

    ZT_UNIT_ASSERT(test, zt_ulong_mul(1, ULONG_MIN) == ULONG_MIN);
    ZT_UNIT_ASSERT(test, zt_ulong_mul(ULONG_MIN, 1) == ULONG_MIN);

    ZT_UNIT_ASSERT(test, zt_ulong_mul(2, ULONG_MAX / 2) == ULONG_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_ulong_mul(ULONG_MAX / 2, 2) == ULONG_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(2, ULONG_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(ULONG_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(2, ULONG_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(ULONG_MAX / 2 + 1, 2)); */
# endif /* ifndef __x86_64__ */
}